

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seqdiff.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__src;
  int *__ptr;
  int *__filename;
  seqdiff_results_t *results;
  sd_lookup_t *psVar1;
  int iVar2;
  int extraout_EAX;
  size_t sVar3;
  int *piVar4;
  FILE *pFVar5;
  gzFile pgVar6;
  kseq_t *pkVar7;
  sd_lookup_t *psVar8;
  void *pvVar9;
  undefined8 *puVar10;
  void *pvVar11;
  bool bVar12;
  sd_lookup_t *psVar13;
  FILE *fp;
  int option_index;
  int local_70;
  int local_6c;
  int *local_68;
  int *local_60;
  undefined4 local_54;
  int *local_50;
  int *local_48;
  int *local_40;
  seqdiff_results_t *local_38;
  
  local_38 = seqdiff_results_init();
  verbose_flag = 0;
  progname = *argv;
  if (argc < 2) {
switchD_001018e1_caseD_68:
    show_usage(1);
switchD_001018e1_caseD_65:
    abort();
  }
  local_60 = (int *)0x0;
  local_68 = (int *)0x0;
  local_40 = (int *)0x0;
  local_48 = (int *)0x0;
  local_50 = (int *)0x0;
  local_6c = 0;
  local_70 = 0;
  do {
    local_54 = 0;
    iVar2 = getopt_long(argc,argv,"vVh?sd1:2:a:b:c:",main::long_options,&local_54);
    __src = _optarg;
    if (iVar2 < 0x61) {
      if (iVar2 < 0x32) {
        if (iVar2 != -1) {
          if (iVar2 == 0x31) {
            sVar3 = strlen(_optarg);
            piVar4 = (int *)malloc(sVar3 + 1);
            local_50 = piVar4;
            goto LAB_00101a0c;
          }
          goto switchD_001018e1_caseD_65;
        }
        bVar12 = false;
      }
      else {
        if (iVar2 == 0x32) {
          sVar3 = strlen(_optarg);
          piVar4 = (int *)malloc(sVar3 + 1);
          local_48 = piVar4;
          goto LAB_00101a0c;
        }
        if (iVar2 == 0x3f) goto LAB_00101a17;
        if (iVar2 != 0x56) goto switchD_001018e1_caseD_65;
        bVar12 = true;
        printf("Version is %f\n",0x3fb999999999999a);
      }
    }
    else {
      switch(iVar2) {
      case 0x61:
        sVar3 = strlen(_optarg);
        piVar4 = (int *)malloc(sVar3 + 1);
        local_40 = piVar4;
        break;
      case 0x62:
        sVar3 = strlen(_optarg);
        piVar4 = (int *)malloc(sVar3 + 1);
        local_60 = piVar4;
        break;
      case 99:
        sVar3 = strlen(_optarg);
        piVar4 = (int *)malloc(sVar3 + 1);
        local_68 = piVar4;
        break;
      case 100:
        bVar12 = true;
        local_6c = 1;
        goto LAB_00101a1a;
      case 0x65:
      case 0x66:
      case 0x67:
        goto switchD_001018e1_caseD_65;
      case 0x68:
        goto switchD_001018e1_caseD_68;
      default:
        if (iVar2 == 0x73) {
          bVar12 = true;
          local_70 = 1;
          goto LAB_00101a1a;
        }
        if (iVar2 == 0x76) {
          verbose_flag = 1;
          goto LAB_00101a17;
        }
        goto switchD_001018e1_caseD_65;
      }
LAB_00101a0c:
      strcpy((char *)piVar4,__src);
LAB_00101a17:
      bVar12 = true;
    }
LAB_00101a1a:
    results = local_38;
    __filename = local_40;
    __ptr = local_48;
    piVar4 = local_50;
  } while (bVar12);
  if (verbose_flag != 0) {
    fwrite("verbose flag is set\n",0x14,1,_stderr);
    fprintf(_stderr,"First file is %s\n",piVar4);
    fprintf(_stderr,"Second file is %s\n",__ptr);
    if (__filename == (int *)0x0) {
      main_cold_2();
    }
    else {
      main_cold_1();
    }
    if (local_6c == 0) {
      main_cold_4();
    }
    else {
      main_cold_3();
    }
    if (local_70 != 0) {
      main_cold_5();
    }
  }
  if (piVar4 == (int *)0x0) {
    main_cold_11();
    return 1;
  }
  if (__ptr == (int *)0x0) {
    main_cold_10();
    return 1;
  }
  results->first_file = (char *)piVar4;
  results->second_file = (char *)__ptr;
  results->use_header = local_6c;
  results->only_summarize = local_70;
  if (((__filename == (int *)0x0) || (local_60 == (int *)0x0)) || (local_68 == (int *)0x0)) {
    cmpseq(results);
LAB_00101bac:
    fprintf(_stderr," first_file_total = %d\n",(ulong)(uint)results->first_file_total);
    fprintf(_stderr,"  first_file_uniq = %d\n",(ulong)(uint)results->first_file_uniq);
    fprintf(_stderr,"second_file_total = %d\n",(ulong)(uint)results->second_file_total);
    fprintf(_stderr," second_file_uniq = %d\n",(ulong)(uint)results->second_file_uniq);
    fprintf(_stderr,"           common = %d\n",(ulong)(uint)results->common);
    free(piVar4);
    free(__ptr);
    if (__filename != (int *)0x0) {
      free(__filename);
    }
    if (local_60 != (int *)0x0) {
      free(local_60);
    }
    if (local_68 != (int *)0x0) {
      free(local_68);
    }
    seqdiff_results_destroy(results);
    fclose(_stderr);
    fclose(_stdout);
    fclose(_stdin);
    return 0;
  }
  pFVar5 = fopen((char *)__filename,"w+");
  results->a_output_fp = (FILE *)pFVar5;
  if (pFVar5 == (FILE *)0x0) {
    main_cold_9();
  }
  else {
    pFVar5 = fopen((char *)local_60,"w+");
    results->b_output_fp = (FILE *)pFVar5;
    if (pFVar5 != (FILE *)0x0) {
      pFVar5 = fopen((char *)local_68,"w+");
      results->c_output_fp = (FILE *)pFVar5;
      if (pFVar5 != (FILE *)0x0) {
        main_cold_6();
        goto LAB_00101bac;
      }
      goto LAB_00101cb6;
    }
  }
  main_cold_8();
LAB_00101cb6:
  main_cold_7();
  pgVar6 = (gzFile)gzopen(*(undefined8 *)(local_68 + 6),"r");
  if (pgVar6 == (gzFile)0x0) {
    local_68 = local_68 + 6;
    cmpseq_cold_2();
  }
  else {
    pkVar7 = kseq_init(pgVar6);
    while (iVar2 = kseq_read(pkVar7), -1 < iVar2) {
      *local_68 = *local_68 + 1;
      sd_add_seq(pkVar7,1,local_68[0x10]);
    }
    kseq_destroy(pkVar7);
    gzclose(pgVar6);
    pgVar6 = (gzFile)gzopen(*(undefined8 *)(local_68 + 8),"r");
    if (pgVar6 != (gzFile)0x0) {
      pkVar7 = kseq_init(pgVar6);
      while (iVar2 = kseq_read(pkVar7), -1 < iVar2) {
        local_68[2] = local_68[2] + 1;
        sd_add_seq(pkVar7,2,local_68[0x10]);
      }
      kseq_destroy(pkVar7);
      gzclose(pgVar6);
      if (sd_lookup == (sd_lookup_t *)0x0) {
LAB_00101e78:
        sd_delete_hash();
        return extraout_EAX;
      }
      psVar1 = (sd_lookup_t *)(sd_lookup->hh).next;
      psVar13 = sd_lookup;
      do {
        psVar8 = psVar1;
        iVar2 = psVar13->in_a;
        if ((iVar2 == 1) && (psVar13->in_b == 0)) {
          local_68[1] = local_68[1] + 1;
          if (local_68[0x11] == 0) {
            fprintf(_stdout,"%s\t\n",psVar13->name);
          }
          fp = *(FILE **)(local_68 + 10);
LAB_00101e43:
          if (fp != (FILE *)0x0) {
            print_fasta(fp,psVar13->name,psVar13->comment,psVar13->seq,0x32);
          }
        }
        else {
          if ((iVar2 == 0) && (psVar13->in_b == 1)) {
            local_68[3] = local_68[3] + 1;
            if (local_68[0x11] == 0) {
              fprintf(_stdout,"\t%s\n",psVar13->name);
            }
            fp = *(FILE **)(local_68 + 0xc);
            goto LAB_00101e43;
          }
          if ((iVar2 == 1) && (psVar13->in_b == 1)) {
            local_68[4] = local_68[4] + 1;
            if (local_68[0x11] == 0) {
              fprintf(_stdout,"%s\t%s\n",psVar13->name);
            }
            fp = *(FILE **)(local_68 + 0xe);
            goto LAB_00101e43;
          }
        }
        if (psVar8 == (sd_lookup_t *)0x0) goto LAB_00101e78;
        psVar1 = (sd_lookup_t *)(psVar8->hh).next;
        psVar13 = psVar8;
      } while( true );
    }
  }
  local_68 = local_68 + 8;
  cmpseq_cold_1();
  pvVar9 = calloc(1,0x70);
  puVar10 = (undefined8 *)calloc(1,0x20);
  puVar10[3] = local_68;
  pvVar11 = malloc(0xffff);
  *puVar10 = pvVar11;
  *(undefined8 **)((long)pvVar9 + 0x68) = puVar10;
  return (int)pvVar9;
}

Assistant:

int main(int argc, char *argv[]) {
	int c;                          /* character for getopt processing */
	/* command argument variables */
	char *first_file = NULL;
	char *second_file = NULL;
	char *a_output_file = NULL;
	char *b_output_file = NULL;
	char *c_output_file = NULL;
	FILE *a_output_fp = NULL;
	FILE *b_output_fp = NULL;
	FILE *c_output_fp = NULL;
	int use_header = 0;
	int only_summarize = 0;

	/* internal variables */
	seqdiff_results_t *results;
	results = seqdiff_results_init();

	extern char *optarg; /* external from getopt */

	verbose_flag = 0; /* assume not verbose */
	progname = argv[0]; /* capture the program name */
	if (argc < 2) {
		show_usage(EXIT_FAILURE);
	}

	while(1) {
		static struct option long_options[] =
		{
			{"verbose",    no_argument, 0, 'v'},
			{"version",    no_argument, 0, 'V'},
			{"help",       no_argument, 0, 'h'},
			{"summary",    no_argument, 0, 's'},
			{"headers",    no_argument, 0, 'd'},
			{"first",      required_argument, 0, '1'},
			{"second",     required_argument, 0, '2'},
			{"a_output",   required_argument, 0, 'a'},
			{"b_output",   required_argument, 0, 'b'},
			{"c_output",   required_argument, 0, 'c'},
			{0, 0, 0, 0}
		};

		/* getopt_long stores the option index here. */
		int option_index = 0;

		c = getopt_long(argc, argv, "vVh?sd1:2:a:b:c:", long_options, &option_index);

		/* Detect the end of the options. */
		if (c == -1)
			break;

		switch (c) {
			case 'v':
				verbose_flag = 1;
				break;

			case 'V':
				/* version */
				printf("Version is %f\n",VERSION);
				break;

			case 'h':
				show_usage(EXIT_FAILURE);
				break;

			case '?':
				/* getopt_long already printed an error message. */
				break;

			case 's':
				only_summarize = 1;
				break;

			case 'd':
				use_header = 1;
				break;

			case '1':
				first_file = (char*) malloc(strlen(optarg)+1);
				strcpy(first_file,optarg);
				break;

			case '2':
				second_file = (char*) malloc(strlen(optarg)+1);
				strcpy(second_file,optarg);
				break;

			case 'a':
				a_output_file = (char*) malloc(strlen(optarg)+1);
				strcpy(a_output_file,optarg);
				break;

			case 'b':
				b_output_file = (char*) malloc(strlen(optarg)+1);
				strcpy(b_output_file,optarg);
				break;

			case 'c':
				c_output_file = (char*) malloc(strlen(optarg)+1);
				strcpy(c_output_file,optarg);
				break;

			default:
				abort ();
		}
	}

	/* Instead of reporting '--verbose'
	   and '--brief' as they are encountered,
	   we report the final status resulting from them. */
	if (verbose_flag) {
		fprintf(stderr, "verbose flag is set\n");
		fprintf(stderr,"First file is %s\n", first_file);
		fprintf(stderr,"Second file is %s\n", second_file);
		if (a_output_file != NULL && a_output_file != NULL && a_output_file != NULL) {
			fprintf(stderr, "Output will be written to files:\n");
			fprintf(stderr, "  first file uniques: %s\n", a_output_file);
			fprintf(stderr, "  second file uniques: %s\n", b_output_file);
			fprintf(stderr, "  common to both input files: %s\n", c_output_file);
		} else
			fprintf(stderr,"No output files will be generated\n");

		if (use_header)
			fprintf(stderr,"Processing will be done using headers, not sequences\n");
		else
			fprintf(stderr,"Processing will be done using sequences\n");
		if (only_summarize)
			fprintf(stderr,"Only showing summary information\n");
	}

	/* check validity of given argument combination */
	if (! first_file) {
		fprintf (stderr, "Error: First sequence file is required.\n");
		return EXIT_FAILURE;
	}

	if (! second_file) {
		fprintf (stderr, "Error: First sequence file is required.\n");
		return EXIT_FAILURE;
	}

	results->first_file = first_file;
	results->second_file = second_file;
	results->use_header = use_header;
	results->only_summarize = only_summarize;
	if (a_output_file != NULL && b_output_file != NULL && c_output_file != NULL) {
		results->a_output_fp = fopen(a_output_file,"w+");
		if (!results->a_output_fp) {
			fprintf(stderr,"%s - failed to open file %s\n",progname,a_output_file);
			exit(EXIT_FAILURE);
		}
		results->b_output_fp = fopen(b_output_file,"w+");
		if (!results->b_output_fp) {
			fprintf(stderr,"%s - failed to open file %s\n",progname,b_output_file);
			exit(EXIT_FAILURE);
		}
		results->c_output_fp = fopen(c_output_file,"w+");
		if (!results->c_output_fp) {
			fprintf(stderr,"%s - failed to open file %s\n",progname,c_output_file);
			exit(EXIT_FAILURE);
		}
	}

	/* do the comparison */
	cmpseq(results);

	if (a_output_file != NULL && b_output_file != NULL && c_output_file != NULL) {
		fclose(results->a_output_fp);
		fclose(results->b_output_fp);
		fclose(results->c_output_fp);
	}

	/* report results */
	fprintf(stderr, " first_file_total = %d\n", results->first_file_total);
	fprintf(stderr, "  first_file_uniq = %d\n", results->first_file_uniq);
	fprintf(stderr, "second_file_total = %d\n", results->second_file_total);
	fprintf(stderr, " second_file_uniq = %d\n", results->second_file_uniq);
	fprintf(stderr, "           common = %d\n",           results->common);

	free(first_file);
	free(second_file);
	if (a_output_file != NULL)
		free(a_output_file);
	if (b_output_file != NULL)
		free(b_output_file);
	if (c_output_file != NULL)
		free(c_output_file);

	/* clean up */
	seqdiff_results_destroy(results);
	fclose(stderr);
	fclose(stdout);
	fclose(stdin);
	return EXIT_SUCCESS;
}